

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O0

int anon_unknown.dwarf_364d1::xRead(sqlite3_file *sfile,void *ptr,int iAmt,sqlite3_int64 iOfst)

{
  ulong uVar1;
  long lVar2;
  undefined8 in_RCX;
  int in_EDX;
  longlong in_RSI;
  long in_RDI;
  qint64 sz;
  File *file;
  undefined4 local_4;
  
  uVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x88))(*(long **)(in_RDI + 8),in_RCX);
  if ((uVar1 & 1) == 0) {
    local_4 = 0x10a;
  }
  else {
    lVar2 = QIODevice::read(*(char **)(in_RDI + 8),in_RSI);
    if (lVar2 < in_EDX) {
      memset((void *)(in_RSI + lVar2),0,in_EDX - lVar2);
      local_4 = 0x20a;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int xRead(sqlite3_file *sfile, void *ptr, int iAmt, sqlite3_int64 iOfst)
{
    auto file = static_cast<File *>(sfile);
    if (!file->pFile->seek(iOfst))
        return SQLITE_IOERR_READ;

    auto sz = file->pFile->read(static_cast<char *>(ptr), iAmt);
    if (sz < iAmt) {
        memset(static_cast<char *>(ptr) + sz, 0, size_t(iAmt - sz));
        return SQLITE_IOERR_SHORT_READ;
    }
    return SQLITE_OK;
}